

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O2

void __thiscall
txpackage_tests::package_sanitization_tests::test_method(package_sanitization_tests *this)

{
  FastRandomContext *this_00;
  long lVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  PackageValidationState *pPVar9;
  CMutableTransaction *pCVar10;
  COutPoint *pCVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_15;
  const_string file_16;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  check_type cVar15;
  char *pcVar14;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  assertion_result local_650;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  Package package_with_dup_tx;
  CMutableTransaction dup_tx;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  Package package_conflicts;
  CMutableTransaction tx_zero_2;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  Package package_duplicate_txids_empty;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  Package package_too_large;
  CTransactionRef large_ptx;
  char *local_2b8;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> local_2b0;
  Init *local_2a8;
  SignalInterrupt *local_2a0;
  char *local_298;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_290;
  char *local_288;
  unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> local_280;
  unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_278;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> local_270;
  char *local_268;
  unique_ptr<BanMan,_std::default_delete<BanMan>_> local_260;
  char *local_258;
  pointer local_250;
  pointer local_248;
  pointer local_240;
  char *local_238;
  pointer local_230;
  Package package_too_many;
  undefined1 local_208 [8];
  undefined1 auStack_200 [24];
  COutPoint rand_prevout;
  PackageValidationState state_conflicts;
  COutPoint same_prevout;
  CMutableTransaction tx_zero_1;
  PackageValidationState state_duplicates;
  PackageValidationState state_too_large;
  PackageValidationState state_too_many;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  package_too_many.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_too_many.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_too_many.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar12 = 0x1a;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::reserve(&package_too_many,0x1a);
  while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
    TxPackageTest::create_placeholder_tx((TxPackageTest *)&state_too_many,(size_t)this,1);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&package_too_many,(shared_ptr<const_CTransaction> *)&state_too_many);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason);
  }
  state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  state_too_many.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_too_many.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0
  ;
  state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
  [0] = '\0';
  state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0
  ;
  state_too_many.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf
  [0] = '\0';
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_230 = (pointer)0xc7791a;
  local_248 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  local_240 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8e;
  file.m_begin = (iterator)&local_238;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_248,msg);
  bVar13 = IsWellFormedPackage(&package_too_many,&state_too_many,true);
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode._0_1_ = !bVar13;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = anon_var_dwarf_1222bcc;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       "";
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_250 = (pointer)0xc7791a;
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&state_conflicts;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&state_duplicates,(lazy_ostream *)&state_too_large,1,0,WARN,_cVar15
             ,(size_t)&local_258,0x8e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_260._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x61);
  local_278._M_t.
  super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>,_true,_true>
        )&boost::unit_test::basic_cstring<char_const>::null;
  local_270._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
  super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
  super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
       (__uniq_ptr_data<PeerManager,_std::default_delete<PeerManager>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8f;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011480b0
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_280._M_t.
  super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>._M_t.
  super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
  super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_NetGroupManager,_std::default_delete<const_NetGroupManager>,_true,_true>
        )((long)
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
         + 0x61);
  pPVar9 = &state_duplicates;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode =
       state_too_many.super_ValidationState<PackageValidationResult>.m_result;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = M_INVALID;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&state_too_large,&local_288,0x8f,1,2,pPVar9,"state_too_many.GetResult()",
             &state_conflicts,"PackageValidationResult::PCKG_POLICY");
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_290._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
  super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x61);
  local_2a8 = (Init *)&boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = (SignalInterrupt *)&boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x90;
  file_01.m_begin = (iterator)&local_298;
  msg_01.m_end = (iterator)pPVar9;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a8,
             msg_01);
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011480b0
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_2b0._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
  super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
  super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
       (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
       + 0x61);
  std::__cxx11::string::string
            ((string *)&state_duplicates,
             &state_too_many.super_ValidationState<PackageValidationResult>.m_reject_reason);
  pcVar14 = "package-too-many-transactions";
  pvVar7 = (iterator)0x2;
  pPVar9 = &state_duplicates;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[30]>
            (&state_too_large,&local_2b8,0x90,1,2,pPVar9,"state_too_many.GetRejectReason()",
             "package-too-many-transactions","\"package-too-many-transactions\"");
  std::__cxx11::string::~string((string *)&state_duplicates);
  TxPackageTest::create_placeholder_tx((TxPackageTest *)&large_ptx,(size_t)this,0x96);
  package_too_large.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_too_large.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package_too_large.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &::TX_NO_WITNESS;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)large_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar3 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&state_too_large);
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ = &::TX_WITH_WITNESS;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)large_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sVar4 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)&state_duplicates);
  for (uVar6 = 0; uVar6 < 0x62a21; uVar6 = uVar6 + (long)((int)sVar4 + (int)sVar3 * 3)) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back(&package_too_large,&large_ptx);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9b;
  file_02.m_begin = (iterator)&local_2f8;
  msg_02.m_end = (iterator)pPVar9;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_308,
             msg_02);
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode._0_1_ =
       (ulong)((long)package_too_large.
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)package_too_large.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x1a0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = anon_var_dwarf_1222c50;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       "";
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0
  ;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_310 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&state_conflicts;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&state_duplicates,(lazy_ostream *)&state_too_large,1,0,WARN,
             (check_type)pcVar14,(size_t)&local_318,0x9b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length);
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  state_too_large.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_too_large.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       0;
  state_too_large.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
  _M_local_buf[0] = '\0';
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9d;
  file_03.m_begin = (iterator)&local_328;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_338,
             msg_03);
  bVar13 = IsWellFormedPackage(&package_too_large,&state_too_large,true);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode._0_1_ = !bVar13;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1222c66;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc77e7d;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_011481f0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_340 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&tx_zero_1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&state_conflicts,(lazy_ostream *)&state_duplicates,1,0,WARN,
             (check_type)pcVar14,(size_t)&local_348,0x9d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x9e;
  file_04.m_begin = (iterator)&local_358;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_368,
             msg_04);
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_011480b0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_370 = "";
  pPVar9 = &state_conflicts;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode =
       state_too_large.super_ValidationState<PackageValidationResult>.m_result;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&state_duplicates,&local_378,0x9e,1,2,pPVar9,"state_too_large.GetResult()",&tx_zero_1,
             "PackageValidationResult::PCKG_POLICY");
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x9f;
  file_05.m_begin = (iterator)&local_388;
  msg_05.m_end = (iterator)pPVar9;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_398,
             msg_05);
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>._0_8_ =
       &PTR__lazy_ostream_011480b0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3a0 = "";
  std::__cxx11::string::string
            ((string *)&state_conflicts,
             &state_too_large.super_ValidationState<PackageValidationResult>.m_reject_reason);
  pcVar14 = "package-too-large";
  pvVar7 = (iterator)0x2;
  pPVar9 = &state_conflicts;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[18]>
            (&state_duplicates,&local_3a8,0x9f);
  std::__cxx11::string::~string((string *)&state_conflicts);
  package_duplicate_txids_empty.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package_duplicate_txids_empty.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package_duplicate_txids_empty.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = 3;
  while (bVar13 = iVar5 != 0, iVar5 = iVar5 + -1, bVar13) {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&state_duplicates);
    std::make_shared<CTransaction_const,CMutableTransaction&>
              ((CMutableTransaction *)&state_conflicts);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                *)&package_duplicate_txids_empty,(shared_ptr<const_CTransaction> *)&state_conflicts)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&state_duplicates);
  }
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       0;
  state_duplicates.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
  _M_local_buf[0] = '\0';
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa8;
  file_06.m_begin = (iterator)&local_3d8;
  msg_06.m_end = (iterator)pPVar9;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3e8,
             msg_06);
  bVar13 = IsWellFormedPackage(&package_duplicate_txids_empty,&state_duplicates,true);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar13);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1222ca4;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc77f2d;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_3f0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&tx_zero_2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_zero_1,(lazy_ostream *)&state_conflicts,1,0,WARN,
             (check_type)pcVar14,(size_t)&local_3f8,0xa8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xa9;
  file_07.m_begin = (iterator)&local_408;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_418,
             msg_07);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011480b0
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_420 = "";
  pCVar10 = &tx_zero_1;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               state_duplicates.super_ValidationState<PackageValidationResult>.
                               m_result);
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&state_conflicts,&local_428,0xa9,1,2,pCVar10,"state_duplicates.GetResult()",&tx_zero_2,
             "PackageValidationResult::PCKG_POLICY");
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xaa;
  file_08.m_begin = (iterator)&local_438;
  msg_08.m_end = (iterator)pCVar10;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_448,
             msg_08);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011480b0
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_450 = "";
  std::__cxx11::string::string
            ((string *)&tx_zero_1,
             &state_duplicates.super_ValidationState<PackageValidationResult>.m_reject_reason);
  pcVar14 = "package-contains-duplicates";
  pvVar7 = (iterator)0x2;
  pCVar10 = &tx_zero_1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (&state_conflicts,&local_458,0xaa,1,2,pCVar10,"state_duplicates.GetRejectReason()",
             "package-contains-duplicates","\"package-contains-duplicates\"");
  std::__cxx11::string::~string((string *)&tx_zero_1);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xab;
  file_09.m_begin = (iterator)&local_468;
  msg_09.m_end = (iterator)pCVar10;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_478,
             msg_09);
  bVar13 = IsConsistentPackage(&package_duplicate_txids_empty);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,!bVar13);
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1222cfa;
  tx_zero_2.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc77fdb;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_480 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&tx_zero_2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx_zero_1,(lazy_ostream *)&state_conflicts,1,0,WARN,
             (check_type)pcVar14,(size_t)&local_488,0xab);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx_zero_1.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CMutableTransaction::CMutableTransaction(&tx_zero_1);
  CMutableTransaction::CMutableTransaction(&tx_zero_2);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_rng;
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)&state_conflicts,&this_00->super_RandomMixin<FastRandomContext>);
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       (undefined1)
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length._1_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length._2_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length._3_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length._4_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length._5_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length._6_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
       _M_string_length._7_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._0_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._1_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._2_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._3_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._4_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._5_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._6_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._7_1_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
       state_conflicts.super_ValidationState<PackageValidationResult>._0_8_;
  same_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p;
  same_prevout.n = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&tx_zero_1,&same_prevout);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&tx_zero_2,&same_prevout);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx_zero_1.vout,&CENT,&P2WSH_OP_TRUE);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = 2000000;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&tx_zero_2.vout,(long *)&state_conflicts,
             &P2WSH_OP_TRUE);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&state_conflicts)
  ;
  std::make_shared<CTransaction_const,CMutableTransaction&>
            ((CMutableTransaction *)
             &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length);
  __l._M_len = 2;
  __l._M_array = (iterator)&state_conflicts;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_conflicts,__l,(allocator_type *)&dup_tx);
  lVar12 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((&same_prevout)[-2].hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + lVar12));
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != -8);
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xb7;
  file_10.m_begin = (iterator)&local_4e8;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4f8,
             msg_10);
  bVar13 = IsConsistentPackage(&package_conflicts);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,!bVar13);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1222d2a;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"!IsConsistentPackage(package_conflicts)" + 0x27;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_500 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&rand_prevout;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dup_tx,(lazy_ostream *)&state_conflicts,1,0,WARN,
             (check_type)pcVar14,(size_t)&local_508,0xb7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xb9;
  file_11.m_begin = (iterator)&local_518;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_528,
             msg_11);
  bVar13 = IsTopoSortedPackage(&package_conflicts);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._1_7_,bVar13);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1222d34;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)"IsTopoSortedPackage(package_conflicts)" + 0x26;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0
  ;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_530 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&rand_prevout;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&dup_tx,(lazy_ostream *)&state_conflicts,1,0,WARN,
             (check_type)pcVar14,(size_t)&local_538,0xb9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_allocated_capacity & 0xffffffffffffff00;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
       0;
  state_conflicts.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
  _M_local_buf[0] = '\0';
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xbb;
  file_12.m_begin = (iterator)&local_548;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_558,
             msg_12);
  bVar13 = IsWellFormedPackage(&package_conflicts,&state_conflicts,true);
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = !bVar13;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_208 = (undefined1  [8])0xc7802b;
  auStack_200._0_8_ = "";
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011481f0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_560 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  dup_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&rand_prevout,(lazy_ostream *)&dup_tx,1,0,WARN,(check_type)pcVar14,
             (size_t)&local_568,0xbb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xbc;
  file_13.m_begin = (iterator)&local_578;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_588,
             msg_13);
  uVar2 = state_conflicts.super_ValidationState<PackageValidationResult>._0_8_;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011480b0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  dup_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xc7f1cc;
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_590 = "";
  pCVar11 = &rand_prevout;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       (undefined1)state_conflicts.super_ValidationState<PackageValidationResult>.m_result;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_result._1_1_;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_result._2_1_;
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       state_conflicts.super_ValidationState<PackageValidationResult>.m_result._3_1_;
  local_208._0_4_ = 1;
  pvVar7 = (iterator)0x2;
  state_conflicts.super_ValidationState<PackageValidationResult>._0_8_ = uVar2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
            (&dup_tx,&local_598,0xbc,1,2,pCVar11,"state_conflicts.GetResult()",(pointer)local_208,
             "PackageValidationResult::PCKG_POLICY");
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xbd;
  file_14.m_begin = (iterator)&local_5a8;
  msg_14.m_end = (iterator)pCVar11;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5b8,
             msg_14);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_011480b0;
  dup_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  dup_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xc7f1cc;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5c0 = "";
  std::__cxx11::string::string
            ((string *)&rand_prevout,
             &state_conflicts.super_ValidationState<PackageValidationResult>.m_reject_reason);
  pcVar14 = "conflict-in-package";
  pvVar7 = (iterator)0x2;
  pCVar11 = &rand_prevout;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[20]>
            (&dup_tx,&local_5c8,0xbd,1,2,pCVar11,"state_conflicts.GetRejectReason()",
             "conflict-in-package","\"conflict-in-package\"");
  std::__cxx11::string::~string((string *)&rand_prevout);
  CMutableTransaction::CMutableTransaction(&dup_tx);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_208,&this_00->super_RandomMixin<FastRandomContext>);
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = auStack_200[8];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = auStack_200[9];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = auStack_200[10];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = auStack_200[0xb];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = auStack_200[0xc];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = auStack_200[0xd];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = auStack_200[0xe];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = auStack_200[0xf];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = auStack_200[0x10];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = auStack_200[0x11];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = auStack_200[0x12];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = auStack_200[0x13];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = auStack_200[0x14];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = auStack_200[0x15];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = auStack_200[0x16];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = auStack_200[0x17];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_208[0];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_208[1];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_208[2];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_208[3];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_208[4];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_208[5];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_208[6];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_208[7];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = auStack_200[0];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = auStack_200[1];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = auStack_200[2];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = auStack_200[3];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = auStack_200[4];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = auStack_200[5];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = auStack_200[6];
  rand_prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = auStack_200[7];
  rand_prevout.n = 0;
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&dup_tx,&rand_prevout);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&>
            ((vector<CTxIn,std::allocator<CTxIn>> *)&dup_tx,&rand_prevout);
  std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)local_208);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_208;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package_with_dup_tx,__l_00,(allocator_type *)&local_650);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_200);
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_620 = "";
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xc6;
  file_15.m_begin = (iterator)&local_628;
  msg_15.m_end = (iterator)pCVar11;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_638,
             msg_15);
  local_650.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsConsistentPackage(&package_with_dup_tx);
  local_650.m_message.px = (element_type *)0x0;
  local_650.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_660 = "IsConsistentPackage(package_with_dup_tx)";
  local_658 = "";
  auStack_200._0_8_ = auStack_200._0_8_ & 0xffffffffffffff00;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  auStack_200._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_668 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  auStack_200._16_8_ = &local_660;
  boost::test_tools::tt_detail::report_assertion
            (&local_650,(lazy_ostream *)local_208,1,0,WARN,(check_type)pcVar14,(size_t)&local_670,
             0xc6);
  boost::detail::shared_count::~shared_count(&local_650.m_message.pn);
  TxPackageTest::create_placeholder_tx((TxPackageTest *)local_208,(size_t)this,1);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&package_with_dup_tx,(shared_ptr<const_CTransaction> *)local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_200);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xc8;
  file_16.m_begin = (iterator)&local_680;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_690,
             msg_16);
  local_650.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)IsConsistentPackage(&package_with_dup_tx);
  local_650.m_message.px = (element_type *)0x0;
  local_650.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_660 = "IsConsistentPackage(package_with_dup_tx)";
  local_658 = "";
  auStack_200._0_8_ = auStack_200._0_8_ & 0xffffffffffffff00;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  auStack_200._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_698 = "";
  auStack_200._16_8_ = &local_660;
  boost::test_tools::tt_detail::report_assertion
            (&local_650,(lazy_ostream *)local_208,1,0,WARN,(check_type)pcVar14,(size_t)&local_6a0,
             200);
  boost::detail::shared_count::~shared_count(&local_650.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_with_dup_tx);
  CMutableTransaction::~CMutableTransaction(&dup_tx);
  ValidationState<PackageValidationResult>::~ValidationState
            (&state_conflicts.super_ValidationState<PackageValidationResult>);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_conflicts);
  CMutableTransaction::~CMutableTransaction(&tx_zero_2);
  CMutableTransaction::~CMutableTransaction(&tx_zero_1);
  ValidationState<PackageValidationResult>::~ValidationState
            (&state_duplicates.super_ValidationState<PackageValidationResult>);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_duplicate_txids_empty);
  ValidationState<PackageValidationResult>::~ValidationState
            (&state_too_large.super_ValidationState<PackageValidationResult>);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_too_large);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&large_ptx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ValidationState<PackageValidationResult>::~ValidationState
            (&state_too_many.super_ValidationState<PackageValidationResult>);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package_too_many);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_sanitization_tests)
{
    // Packages can't have more than 25 transactions.
    Package package_too_many;
    package_too_many.reserve(MAX_PACKAGE_COUNT + 1);
    for (size_t i{0}; i < MAX_PACKAGE_COUNT + 1; ++i) {
        package_too_many.emplace_back(create_placeholder_tx(1, 1));
    }
    PackageValidationState state_too_many;
    BOOST_CHECK(!IsWellFormedPackage(package_too_many, state_too_many, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_too_many.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_too_many.GetRejectReason(), "package-too-many-transactions");

    // Packages can't have a total weight of more than 404'000WU.
    CTransactionRef large_ptx = create_placeholder_tx(150, 150);
    Package package_too_large;
    auto size_large = GetTransactionWeight(*large_ptx);
    size_t total_weight{0};
    while (total_weight <= MAX_PACKAGE_WEIGHT) {
        package_too_large.push_back(large_ptx);
        total_weight += size_large;
    }
    BOOST_CHECK(package_too_large.size() <= MAX_PACKAGE_COUNT);
    PackageValidationState state_too_large;
    BOOST_CHECK(!IsWellFormedPackage(package_too_large, state_too_large, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_too_large.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_too_large.GetRejectReason(), "package-too-large");

    // Packages can't contain transactions with the same txid.
    Package package_duplicate_txids_empty;
    for (auto i{0}; i < 3; ++i) {
        CMutableTransaction empty_tx;
        package_duplicate_txids_empty.emplace_back(MakeTransactionRef(empty_tx));
    }
    PackageValidationState state_duplicates;
    BOOST_CHECK(!IsWellFormedPackage(package_duplicate_txids_empty, state_duplicates, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_duplicates.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_duplicates.GetRejectReason(), "package-contains-duplicates");
    BOOST_CHECK(!IsConsistentPackage(package_duplicate_txids_empty));

    // Packages can't have transactions spending the same prevout
    CMutableTransaction tx_zero_1;
    CMutableTransaction tx_zero_2;
    COutPoint same_prevout{Txid::FromUint256(m_rng.rand256()), 0};
    tx_zero_1.vin.emplace_back(same_prevout);
    tx_zero_2.vin.emplace_back(same_prevout);
    // Different vouts (not the same tx)
    tx_zero_1.vout.emplace_back(CENT, P2WSH_OP_TRUE);
    tx_zero_2.vout.emplace_back(2 * CENT, P2WSH_OP_TRUE);
    Package package_conflicts{MakeTransactionRef(tx_zero_1), MakeTransactionRef(tx_zero_2)};
    BOOST_CHECK(!IsConsistentPackage(package_conflicts));
    // Transactions are considered sorted when they have no dependencies.
    BOOST_CHECK(IsTopoSortedPackage(package_conflicts));
    PackageValidationState state_conflicts;
    BOOST_CHECK(!IsWellFormedPackage(package_conflicts, state_conflicts, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_conflicts.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_conflicts.GetRejectReason(), "conflict-in-package");

    // IsConsistentPackage only cares about conflicts between transactions, not about a transaction
    // conflicting with itself (i.e. duplicate prevouts in vin).
    CMutableTransaction dup_tx;
    const COutPoint rand_prevout{Txid::FromUint256(m_rng.rand256()), 0};
    dup_tx.vin.emplace_back(rand_prevout);
    dup_tx.vin.emplace_back(rand_prevout);
    Package package_with_dup_tx{MakeTransactionRef(dup_tx)};
    BOOST_CHECK(IsConsistentPackage(package_with_dup_tx));
    package_with_dup_tx.emplace_back(create_placeholder_tx(1, 1));
    BOOST_CHECK(IsConsistentPackage(package_with_dup_tx));
}